

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_text_runes(nk_str *str,int pos,nk_rune *runes,int len)

{
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  nk_glyph glyph;
  int byte_len;
  int i;
  int clen;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  clen = 0;
  if (((in_RDI == 0) || (in_RDX == 0)) || (in_ECX == 0)) {
    in_ECX = 0;
  }
  else {
    iVar1 = 0;
    while ((iVar1 < in_ECX &&
           (clen = nk_utf_encode((nk_rune)in_RDX,(char *)CONCAT44(in_ECX,iVar1),clen), clen != 0)))
    {
      nk_str_insert_at_rune
                ((nk_str *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                 (int)((ulong)in_RDX >> 0x20));
      iVar1 = iVar1 + 1;
    }
  }
  return in_ECX;
}

Assistant:

NK_API int
nk_str_insert_text_runes(struct nk_str *str, int pos, const nk_rune *runes, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_glyph glyph;

    NK_ASSERT(str);
    if (!str || !runes || !len) return 0;
    for (i = 0; i < len; ++i) {
        byte_len = nk_utf_encode(runes[i], glyph, NK_UTF_SIZE);
        if (!byte_len) break;
        nk_str_insert_at_rune(str, pos+i, glyph, byte_len);
    }
    return len;
}